

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<8,_16777232,_true,_embree::avx::ArrayIntersector1<embree::avx::QuadMiMBIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Scene *pSVar8;
  Ref<embree::Geometry> *pRVar9;
  Geometry *pGVar10;
  long lVar11;
  long lVar12;
  RTCIntersectArguments *pRVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  bool bVar68;
  AABBNodeMB4D *node1;
  ulong uVar69;
  ulong uVar70;
  long lVar71;
  int iVar72;
  long lVar73;
  ulong uVar74;
  long lVar75;
  ulong uVar76;
  ulong uVar77;
  ulong uVar78;
  long lVar79;
  ulong uVar80;
  ulong uVar81;
  ulong uVar82;
  ulong uVar83;
  ulong uVar84;
  ulong uVar85;
  ulong uVar86;
  ulong unaff_R13;
  size_t mask;
  ulong uVar87;
  ulong uVar88;
  bool bVar89;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar90;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  float fVar101;
  float fVar102;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar103 [32];
  float fVar107;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined8 extraout_XMM1_Qa_00;
  float fVar108;
  undefined1 auVar106 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  float fVar116;
  float fVar120;
  undefined1 auVar114 [32];
  float fVar117;
  float fVar118;
  float fVar119;
  undefined1 auVar115 [64];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  float fVar129;
  undefined1 auVar128 [64];
  undefined1 auVar134 [16];
  float fVar130;
  float fVar140;
  float fVar141;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar142;
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  float fVar143;
  float fVar144;
  float fVar145;
  undefined1 auVar139 [64];
  float fVar146;
  float fVar147;
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  undefined1 auVar150 [64];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  float fVar166;
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  float fVar173;
  float fVar177;
  undefined1 auVar169 [32];
  float fVar171;
  float fVar172;
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar170 [64];
  float fVar179;
  undefined1 auVar178 [64];
  float fVar180;
  undefined1 auVar181 [32];
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  undefined1 auVar182 [64];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  float fVar198;
  undefined1 auVar199 [32];
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  undefined1 auVar200 [64];
  float fVar207;
  float fVar208;
  undefined1 auVar209 [32];
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  undefined1 auVar210 [64];
  float fVar223;
  float fVar225;
  undefined1 auVar224 [64];
  undefined1 auVar226 [16];
  undefined1 auVar227 [32];
  undefined1 auVar228 [64];
  float fVar229;
  float fVar230;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  undefined1 auVar231 [64];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  int local_18b4;
  ulong local_18b0;
  ulong local_18a8;
  ulong local_18a0;
  ulong local_1898;
  ulong local_1890;
  ulong *local_1888;
  float local_1880;
  float fStack_187c;
  float fStack_1878;
  float fStack_1874;
  float fStack_1870;
  float fStack_186c;
  float fStack_1868;
  float fStack_1864;
  ulong local_1848;
  ulong local_1840;
  ulong local_1838;
  long local_1830;
  ulong local_1828;
  uint local_1820;
  float local_181c;
  float local_1818;
  undefined4 local_1814;
  uint local_1810;
  undefined4 local_180c;
  uint local_1808;
  uint local_1804;
  uint local_1800;
  RTCFilterFunctionNArguments local_17f0;
  float local_17c0;
  float fStack_17bc;
  float fStack_17b8;
  float fStack_17b4;
  float fStack_17b0;
  float fStack_17ac;
  float fStack_17a8;
  float fStack_17a4;
  undefined1 local_17a0 [32];
  undefined1 local_1780 [32];
  undefined1 local_1760 [32];
  undefined1 local_1740 [32];
  undefined1 local_1720 [32];
  undefined1 local_1700 [32];
  undefined1 local_16e0 [32];
  undefined1 local_16c0 [32];
  undefined1 local_16a0 [32];
  undefined1 local_1680 [32];
  undefined1 local_1660 [8];
  float fStack_1658;
  float fStack_1654;
  undefined1 local_1640 [8];
  float fStack_1638;
  float fStack_1634;
  undefined1 local_1620 [8];
  float fStack_1618;
  float fStack_1614;
  undefined1 local_1600 [32];
  undefined1 local_15e0 [8];
  float fStack_15d8;
  float fStack_15d4;
  undefined1 local_15c0 [8];
  float fStack_15b8;
  float fStack_15b4;
  undefined4 uStack_15a4;
  undefined1 local_15a0 [32];
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [8];
  float fStack_14d8;
  float fStack_14d4;
  undefined1 local_14d0 [8];
  float fStack_14c8;
  float fStack_14c4;
  undefined1 local_14c0 [8];
  float fStack_14b8;
  float fStack_14b4;
  undefined1 local_14b0 [8];
  float fStack_14a8;
  float fStack_14a4;
  undefined1 local_14a0 [8];
  float fStack_1498;
  float fStack_1494;
  undefined1 local_1490 [8];
  float fStack_1488;
  float fStack_1484;
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [8];
  float fStack_1418;
  float fStack_1414;
  float fStack_1410;
  float fStack_140c;
  float fStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  float fStack_13a8;
  float fStack_13a4;
  float local_13a0;
  float fStack_139c;
  float fStack_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  float fStack_1388;
  float fStack_1384;
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  float local_1240 [4];
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  undefined4 uStack_1224;
  undefined1 local_1220 [32];
  ulong local_1200;
  ulong local_11f8 [569];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar130 = ray->tfar;
    if (0.0 <= fVar130) {
      local_1888 = local_11f8;
      aVar5 = (ray->dir).field_0;
      auVar92 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar91._8_4_ = 0x7fffffff;
      auVar91._0_8_ = 0x7fffffff7fffffff;
      auVar91._12_4_ = 0x7fffffff;
      auVar91 = vandps_avx((undefined1  [16])aVar5,auVar91);
      auVar131._8_4_ = 0x219392ef;
      auVar131._0_8_ = 0x219392ef219392ef;
      auVar131._12_4_ = 0x219392ef;
      auVar91 = vcmpps_avx(auVar91,auVar131,1);
      auVar132._8_4_ = 0x3f800000;
      auVar132._0_8_ = &DAT_3f8000003f800000;
      auVar132._12_4_ = 0x3f800000;
      auVar131 = vdivps_avx(auVar132,(undefined1  [16])aVar5);
      auVar133._8_4_ = 0x5d5e0b6b;
      auVar133._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar133._12_4_ = 0x5d5e0b6b;
      auVar91 = vblendvps_avx(auVar131,auVar133,auVar91);
      local_1200 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar121._0_4_ = auVar91._0_4_ * 0.99999964;
      auVar121._4_4_ = auVar91._4_4_ * 0.99999964;
      auVar121._8_4_ = auVar91._8_4_ * 0.99999964;
      auVar121._12_4_ = auVar91._12_4_ * 0.99999964;
      uVar3 = *(undefined4 *)&(ray->org).field_0;
      local_16a0._4_4_ = uVar3;
      local_16a0._0_4_ = uVar3;
      local_16a0._8_4_ = uVar3;
      local_16a0._12_4_ = uVar3;
      local_16a0._16_4_ = uVar3;
      local_16a0._20_4_ = uVar3;
      local_16a0._24_4_ = uVar3;
      local_16a0._28_4_ = uVar3;
      auVar170 = ZEXT3264(local_16a0);
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_16c0._4_4_ = uVar3;
      local_16c0._0_4_ = uVar3;
      local_16c0._8_4_ = uVar3;
      local_16c0._12_4_ = uVar3;
      local_16c0._16_4_ = uVar3;
      local_16c0._20_4_ = uVar3;
      local_16c0._24_4_ = uVar3;
      local_16c0._28_4_ = uVar3;
      auVar178 = ZEXT3264(local_16c0);
      auVar109._0_4_ = auVar91._0_4_ * 1.0000004;
      auVar109._4_4_ = auVar91._4_4_ * 1.0000004;
      auVar109._8_4_ = auVar91._8_4_ * 1.0000004;
      auVar109._12_4_ = auVar91._12_4_ * 1.0000004;
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_16e0._4_4_ = uVar3;
      local_16e0._0_4_ = uVar3;
      local_16e0._8_4_ = uVar3;
      local_16e0._12_4_ = uVar3;
      local_16e0._16_4_ = uVar3;
      local_16e0._20_4_ = uVar3;
      local_16e0._24_4_ = uVar3;
      local_16e0._28_4_ = uVar3;
      auVar182 = ZEXT3264(local_16e0);
      auVar91 = vshufps_avx(auVar121,auVar121,0);
      register0x00001310 = auVar91;
      _local_1420 = auVar91;
      auVar91 = vmovshdup_avx(auVar121);
      auVar139 = ZEXT1664(auVar91);
      auVar131 = vshufps_avx(auVar121,auVar121,0x55);
      local_1700._16_16_ = auVar131;
      local_1700._0_16_ = auVar131;
      auVar200 = ZEXT3264(local_1700);
      auVar131 = vshufpd_avx(auVar121,auVar121,1);
      auVar132 = vshufps_avx(auVar121,auVar121,0xaa);
      local_1720._16_16_ = auVar132;
      local_1720._0_16_ = auVar132;
      auVar210 = ZEXT3264(local_1720);
      auVar132 = vshufps_avx(auVar109,auVar109,0);
      local_1740._16_16_ = auVar132;
      local_1740._0_16_ = auVar132;
      auVar224 = ZEXT3264(local_1740);
      auVar132 = vshufps_avx(auVar109,auVar109,0x55);
      auVar128 = ZEXT1664(auVar132);
      local_1760._16_16_ = auVar132;
      local_1760._0_16_ = auVar132;
      auVar228 = ZEXT3264(local_1760);
      auVar132 = vshufps_avx(auVar109,auVar109,0xaa);
      auVar115 = ZEXT1664(auVar132);
      uVar77 = (ulong)(auVar121._0_4_ < 0.0) << 5;
      local_1780._16_16_ = auVar132;
      local_1780._0_16_ = auVar132;
      auVar231 = ZEXT3264(local_1780);
      uVar81 = (ulong)(auVar91._0_4_ < 0.0) << 5 | 0x40;
      uVar85 = (ulong)(auVar131._0_4_ < 0.0) << 5 | 0x80;
      uVar74 = uVar77 ^ 0x20;
      uVar88 = uVar81 ^ 0x20;
      local_1828 = uVar85 ^ 0x20;
      auVar91 = vshufps_avx(auVar92,auVar92,0);
      local_17a0._16_16_ = auVar91;
      local_17a0._0_16_ = auVar91;
      auVar150 = ZEXT3264(local_17a0);
      auVar91 = vshufps_avx(ZEXT416((uint)fVar130),ZEXT416((uint)fVar130),0);
      local_1440._16_16_ = auVar91;
      local_1440._0_16_ = auVar91;
      local_1460._16_16_ = mm_lookupmask_ps._240_16_;
      local_1460._0_16_ = mm_lookupmask_ps._0_16_;
      auVar106 = ZEXT3264(local_1460);
      auVar195._8_4_ = 0x3f800000;
      auVar195._0_8_ = &DAT_3f8000003f800000;
      auVar195._12_4_ = 0x3f800000;
      auVar195._16_4_ = 0x3f800000;
      auVar195._20_4_ = 0x3f800000;
      auVar195._24_4_ = 0x3f800000;
      auVar195._28_4_ = 0x3f800000;
      auVar93._8_4_ = 0xbf800000;
      auVar93._0_8_ = 0xbf800000bf800000;
      auVar93._12_4_ = 0xbf800000;
      auVar93._16_4_ = 0xbf800000;
      auVar93._20_4_ = 0xbf800000;
      auVar93._24_4_ = 0xbf800000;
      auVar93._28_4_ = 0xbf800000;
      local_1480 = vblendvps_avx(auVar195,auVar93,local_1460);
      local_18b0 = uVar88;
      local_18a8 = uVar74;
      local_18a0 = uVar85;
      local_1898 = uVar81;
      local_1890 = uVar77;
      do {
        if (local_1888 == &local_1200) {
          return;
        }
        uVar87 = local_1888[-1];
        local_1888 = local_1888 + -1;
        do {
          if ((uVar87 & 8) == 0) {
            uVar69 = uVar87 & 0xfffffffffffffff0;
            fVar130 = (ray->dir).field_0.m128[3];
            auVar94._4_4_ = fVar130;
            auVar94._0_4_ = fVar130;
            auVar94._8_4_ = fVar130;
            auVar94._12_4_ = fVar130;
            auVar94._16_4_ = fVar130;
            auVar94._20_4_ = fVar130;
            auVar94._24_4_ = fVar130;
            auVar94._28_4_ = fVar130;
            pfVar2 = (float *)(uVar69 + 0x100 + uVar77);
            pfVar1 = (float *)(uVar69 + 0x40 + uVar77);
            auVar103._0_4_ = fVar130 * *pfVar2 + *pfVar1;
            auVar103._4_4_ = fVar130 * pfVar2[1] + pfVar1[1];
            auVar103._8_4_ = fVar130 * pfVar2[2] + pfVar1[2];
            auVar103._12_4_ = fVar130 * pfVar2[3] + pfVar1[3];
            auVar103._16_4_ = fVar130 * pfVar2[4] + pfVar1[4];
            auVar103._20_4_ = fVar130 * pfVar2[5] + pfVar1[5];
            auVar103._24_4_ = fVar130 * pfVar2[6] + pfVar1[6];
            auVar103._28_4_ = auVar106._28_4_ + pfVar1[7];
            auVar93 = vsubps_avx(auVar103,auVar170._0_32_);
            auVar20._4_4_ = auVar93._4_4_ * (float)local_1420._4_4_;
            auVar20._0_4_ = auVar93._0_4_ * (float)local_1420._0_4_;
            auVar20._8_4_ = auVar93._8_4_ * fStack_1418;
            auVar20._12_4_ = auVar93._12_4_ * fStack_1414;
            auVar20._16_4_ = auVar93._16_4_ * fStack_1410;
            auVar20._20_4_ = auVar93._20_4_ * fStack_140c;
            auVar20._24_4_ = auVar93._24_4_ * fStack_1408;
            auVar20._28_4_ = auVar93._28_4_;
            pfVar2 = (float *)(uVar69 + 0x100 + uVar81);
            pfVar1 = (float *)(uVar69 + 0x40 + uVar81);
            auVar111._0_4_ = fVar130 * *pfVar2 + *pfVar1;
            auVar111._4_4_ = fVar130 * pfVar2[1] + pfVar1[1];
            auVar111._8_4_ = fVar130 * pfVar2[2] + pfVar1[2];
            auVar111._12_4_ = fVar130 * pfVar2[3] + pfVar1[3];
            auVar111._16_4_ = fVar130 * pfVar2[4] + pfVar1[4];
            auVar111._20_4_ = fVar130 * pfVar2[5] + pfVar1[5];
            auVar111._24_4_ = fVar130 * pfVar2[6] + pfVar1[6];
            auVar111._28_4_ = auVar115._28_4_ + pfVar1[7];
            auVar93 = vmaxps_avx(auVar150._0_32_,auVar20);
            auVar195 = vsubps_avx(auVar111,auVar178._0_32_);
            pfVar2 = (float *)(uVar69 + 0x100 + uVar85);
            auVar21._4_4_ = auVar200._4_4_ * auVar195._4_4_;
            auVar21._0_4_ = auVar200._0_4_ * auVar195._0_4_;
            auVar21._8_4_ = auVar200._8_4_ * auVar195._8_4_;
            auVar21._12_4_ = auVar200._12_4_ * auVar195._12_4_;
            auVar21._16_4_ = auVar200._16_4_ * auVar195._16_4_;
            auVar21._20_4_ = auVar200._20_4_ * auVar195._20_4_;
            auVar21._24_4_ = auVar200._24_4_ * auVar195._24_4_;
            auVar21._28_4_ = auVar195._28_4_;
            pfVar1 = (float *)(uVar69 + 0x40 + uVar85);
            auVar122._0_4_ = fVar130 * *pfVar2 + *pfVar1;
            auVar122._4_4_ = fVar130 * pfVar2[1] + pfVar1[1];
            auVar122._8_4_ = fVar130 * pfVar2[2] + pfVar1[2];
            auVar122._12_4_ = fVar130 * pfVar2[3] + pfVar1[3];
            auVar122._16_4_ = fVar130 * pfVar2[4] + pfVar1[4];
            auVar122._20_4_ = fVar130 * pfVar2[5] + pfVar1[5];
            auVar122._24_4_ = fVar130 * pfVar2[6] + pfVar1[6];
            auVar122._28_4_ = auVar128._28_4_ + pfVar1[7];
            auVar20 = vsubps_avx(auVar122,auVar182._0_32_);
            auVar22._4_4_ = auVar210._4_4_ * auVar20._4_4_;
            auVar22._0_4_ = auVar210._0_4_ * auVar20._0_4_;
            auVar22._8_4_ = auVar210._8_4_ * auVar20._8_4_;
            auVar22._12_4_ = auVar210._12_4_ * auVar20._12_4_;
            auVar22._16_4_ = auVar210._16_4_ * auVar20._16_4_;
            auVar22._20_4_ = auVar210._20_4_ * auVar20._20_4_;
            auVar22._24_4_ = auVar210._24_4_ * auVar20._24_4_;
            auVar22._28_4_ = auVar20._28_4_;
            auVar195 = vmaxps_avx(auVar21,auVar22);
            pfVar2 = (float *)(uVar69 + 0x100 + uVar74);
            auVar93 = vmaxps_avx(auVar93,auVar195);
            pfVar1 = (float *)(uVar69 + 0x40 + uVar74);
            auVar112._0_4_ = fVar130 * *pfVar2 + *pfVar1;
            auVar112._4_4_ = fVar130 * pfVar2[1] + pfVar1[1];
            auVar112._8_4_ = fVar130 * pfVar2[2] + pfVar1[2];
            auVar112._12_4_ = fVar130 * pfVar2[3] + pfVar1[3];
            auVar112._16_4_ = fVar130 * pfVar2[4] + pfVar1[4];
            auVar112._20_4_ = fVar130 * pfVar2[5] + pfVar1[5];
            auVar112._24_4_ = fVar130 * pfVar2[6] + pfVar1[6];
            auVar112._28_4_ = auVar20._28_4_ + pfVar1[7];
            auVar195 = vsubps_avx(auVar112,auVar170._0_32_);
            auVar23._4_4_ = auVar224._4_4_ * auVar195._4_4_;
            auVar23._0_4_ = auVar224._0_4_ * auVar195._0_4_;
            auVar23._8_4_ = auVar224._8_4_ * auVar195._8_4_;
            auVar23._12_4_ = auVar224._12_4_ * auVar195._12_4_;
            auVar23._16_4_ = auVar224._16_4_ * auVar195._16_4_;
            auVar23._20_4_ = auVar224._20_4_ * auVar195._20_4_;
            auVar23._24_4_ = auVar224._24_4_ * auVar195._24_4_;
            auVar23._28_4_ = auVar195._28_4_;
            auVar195 = vminps_avx(local_1440,auVar23);
            pfVar2 = (float *)(uVar69 + 0x100 + uVar88);
            pfVar1 = (float *)(uVar69 + 0x40 + uVar88);
            auVar123._0_4_ = fVar130 * *pfVar2 + *pfVar1;
            auVar123._4_4_ = fVar130 * pfVar2[1] + pfVar1[1];
            auVar123._8_4_ = fVar130 * pfVar2[2] + pfVar1[2];
            auVar123._12_4_ = fVar130 * pfVar2[3] + pfVar1[3];
            auVar123._16_4_ = fVar130 * pfVar2[4] + pfVar1[4];
            auVar123._20_4_ = fVar130 * pfVar2[5] + pfVar1[5];
            auVar123._24_4_ = fVar130 * pfVar2[6] + pfVar1[6];
            auVar123._28_4_ = local_1440._28_4_ + pfVar1[7];
            auVar20 = vsubps_avx(auVar123,auVar178._0_32_);
            auVar24._4_4_ = auVar228._4_4_ * auVar20._4_4_;
            auVar24._0_4_ = auVar228._0_4_ * auVar20._0_4_;
            auVar24._8_4_ = auVar228._8_4_ * auVar20._8_4_;
            auVar24._12_4_ = auVar228._12_4_ * auVar20._12_4_;
            auVar24._16_4_ = auVar228._16_4_ * auVar20._16_4_;
            auVar24._20_4_ = auVar228._20_4_ * auVar20._20_4_;
            auVar24._24_4_ = auVar228._24_4_ * auVar20._24_4_;
            auVar24._28_4_ = auVar20._28_4_;
            pfVar2 = (float *)(uVar69 + 0x100 + local_1828);
            pfVar1 = (float *)(uVar69 + 0x40 + local_1828);
            auVar135._0_4_ = fVar130 * *pfVar2 + *pfVar1;
            auVar135._4_4_ = fVar130 * pfVar2[1] + pfVar1[1];
            auVar135._8_4_ = fVar130 * pfVar2[2] + pfVar1[2];
            auVar135._12_4_ = fVar130 * pfVar2[3] + pfVar1[3];
            auVar135._16_4_ = fVar130 * pfVar2[4] + pfVar1[4];
            auVar135._20_4_ = fVar130 * pfVar2[5] + pfVar1[5];
            auVar135._24_4_ = fVar130 * pfVar2[6] + pfVar1[6];
            auVar135._28_4_ = auVar139._28_4_ + pfVar1[7];
            auVar20 = vsubps_avx(auVar135,auVar182._0_32_);
            auVar25._4_4_ = auVar231._4_4_ * auVar20._4_4_;
            auVar25._0_4_ = auVar231._0_4_ * auVar20._0_4_;
            auVar25._8_4_ = auVar231._8_4_ * auVar20._8_4_;
            auVar25._12_4_ = auVar231._12_4_ * auVar20._12_4_;
            auVar25._16_4_ = auVar231._16_4_ * auVar20._16_4_;
            auVar25._20_4_ = auVar231._20_4_ * auVar20._20_4_;
            auVar25._24_4_ = auVar231._24_4_ * auVar20._24_4_;
            auVar25._28_4_ = auVar20._28_4_;
            auVar139 = ZEXT3264(auVar25);
            auVar20 = vminps_avx(auVar24,auVar25);
            auVar128 = ZEXT3264(auVar20);
            auVar195 = vminps_avx(auVar195,auVar20);
            auVar93 = vcmpps_avx(auVar93,auVar195,2);
            auVar106 = ZEXT3264(auVar93);
            if (((uint)uVar87 & 7) == 6) {
              auVar195 = vcmpps_avx(*(undefined1 (*) [32])(uVar69 + 0x1c0),auVar94,2);
              auVar20 = vcmpps_avx(auVar94,*(undefined1 (*) [32])(uVar69 + 0x1e0),1);
              auVar20 = vandps_avx(auVar195,auVar20);
              auVar93 = vandps_avx(auVar20,auVar93);
              auVar106 = ZEXT1664(auVar93._16_16_);
              auVar91 = vpackssdw_avx(auVar93._0_16_,auVar93._16_16_);
            }
            else {
              auVar91 = vpackssdw_avx(auVar93._0_16_,auVar93._16_16_);
            }
            auVar115 = ZEXT3264(auVar195);
            auVar91 = vpsllw_avx(auVar91,0xf);
            auVar91 = vpacksswb_avx(auVar91,auVar91);
            unaff_R13 = (ulong)(byte)(SUB161(auVar91 >> 7,0) & 1 |
                                      (SUB161(auVar91 >> 0xf,0) & 1) << 1 |
                                      (SUB161(auVar91 >> 0x17,0) & 1) << 2 |
                                      (SUB161(auVar91 >> 0x1f,0) & 1) << 3 |
                                      (SUB161(auVar91 >> 0x27,0) & 1) << 4 |
                                      (SUB161(auVar91 >> 0x2f,0) & 1) << 5 |
                                      (SUB161(auVar91 >> 0x37,0) & 1) << 6 |
                                     SUB161(auVar91 >> 0x3f,0) << 7);
          }
          if ((uVar87 & 8) == 0) {
            if (unaff_R13 == 0) {
              iVar72 = 4;
            }
            else {
              uVar69 = uVar87 & 0xfffffffffffffff0;
              lVar73 = 0;
              if (unaff_R13 != 0) {
                for (; (unaff_R13 >> lVar73 & 1) == 0; lVar73 = lVar73 + 1) {
                }
              }
              iVar72 = 0;
              uVar87 = *(ulong *)(uVar69 + lVar73 * 8);
              uVar76 = unaff_R13 - 1 & unaff_R13;
              if (uVar76 != 0) {
                *local_1888 = uVar87;
                lVar73 = 0;
                if (uVar76 != 0) {
                  for (; (uVar76 >> lVar73 & 1) == 0; lVar73 = lVar73 + 1) {
                  }
                }
                uVar70 = uVar76 - 1;
                while( true ) {
                  local_1888 = local_1888 + 1;
                  uVar87 = *(ulong *)(uVar69 + lVar73 * 8);
                  uVar70 = uVar70 & uVar76;
                  if (uVar70 == 0) break;
                  *local_1888 = uVar87;
                  lVar73 = 0;
                  if (uVar70 != 0) {
                    for (; (uVar70 >> lVar73 & 1) == 0; lVar73 = lVar73 + 1) {
                    }
                  }
                  uVar76 = uVar70 - 1;
                }
              }
            }
          }
          else {
            iVar72 = 6;
          }
        } while (iVar72 == 0);
        if (iVar72 == 6) {
          iVar72 = 0;
          local_1848 = (ulong)((uint)uVar87 & 0xf) - 8;
          bVar89 = local_1848 != 0;
          if (bVar89) {
            uVar87 = uVar87 & 0xfffffffffffffff0;
            pSVar8 = context->scene;
            local_1840 = 0;
            do {
              lVar71 = local_1840 * 0x60;
              pRVar9 = (pSVar8->geometries).items;
              pGVar10 = pRVar9[*(uint *)(uVar87 + 0x40 + lVar71)].ptr;
              fVar130 = (pGVar10->time_range).lower;
              fVar130 = pGVar10->fnumTimeSegments *
                        (((ray->dir).field_0.m128[3] - fVar130) /
                        ((pGVar10->time_range).upper - fVar130));
              auVar91 = vroundss_avx(ZEXT416((uint)fVar130),ZEXT416((uint)fVar130),9);
              auVar91 = vminss_avx(auVar91,ZEXT416((uint)(pGVar10->fnumTimeSegments + -1.0)));
              auVar226 = vmaxss_avx(ZEXT816(0) << 0x20,auVar91);
              iVar72 = (int)auVar226._0_4_;
              lVar79 = (long)iVar72 * 0x38;
              lVar73 = *(long *)(*(long *)&pGVar10[2].numPrimitives + lVar79);
              uVar78 = (ulong)*(uint *)(uVar87 + 4 + lVar71);
              auVar91 = *(undefined1 (*) [16])(lVar73 + (ulong)*(uint *)(uVar87 + lVar71) * 4);
              uVar77 = (ulong)*(uint *)(uVar87 + 0x10 + lVar71);
              auVar131 = *(undefined1 (*) [16])(lVar73 + uVar77 * 4);
              uVar81 = (ulong)*(uint *)(uVar87 + 0x20 + lVar71);
              auVar92 = *(undefined1 (*) [16])(lVar73 + uVar81 * 4);
              uVar85 = (ulong)*(uint *)(uVar87 + 0x30 + lVar71);
              auVar132 = *(undefined1 (*) [16])(lVar73 + uVar85 * 4);
              local_1830 = *(long *)&pRVar9[*(uint *)(uVar87 + 0x44 + lVar71)].ptr[2].numPrimitives;
              lVar73 = *(long *)(local_1830 + lVar79);
              auVar109 = *(undefined1 (*) [16])(lVar73 + uVar78 * 4);
              uVar88 = (ulong)*(uint *)(uVar87 + 0x14 + lVar71);
              auVar121 = *(undefined1 (*) [16])(lVar73 + uVar88 * 4);
              uVar69 = (ulong)*(uint *)(uVar87 + 0x24 + lVar71);
              auVar133 = *(undefined1 (*) [16])(lVar73 + uVar69 * 4);
              uVar76 = (ulong)*(uint *)(uVar87 + 0x34 + lVar71);
              auVar6 = *(undefined1 (*) [16])(lVar73 + uVar76 * 4);
              lVar73 = *(long *)&pRVar9[*(uint *)(uVar87 + 0x48 + lVar71)].ptr[2].numPrimitives;
              lVar11 = *(long *)(lVar73 + lVar79);
              uVar70 = (ulong)*(uint *)(uVar87 + 8 + lVar71);
              auVar134 = *(undefined1 (*) [16])(lVar11 + uVar70 * 4);
              local_1838 = (ulong)*(uint *)(uVar87 + 0x18 + lVar71);
              auVar110 = *(undefined1 (*) [16])(lVar11 + local_1838 * 4);
              uVar82 = (ulong)*(uint *)(uVar87 + 0x28 + lVar71);
              auVar148 = *(undefined1 (*) [16])(lVar11 + uVar82 * 4);
              uVar83 = (ulong)*(uint *)(uVar87 + 0x38 + lVar71);
              auVar167 = *(undefined1 (*) [16])(lVar11 + uVar83 * 4);
              fVar130 = fVar130 - auVar226._0_4_;
              lVar11 = *(long *)&pRVar9[*(uint *)(uVar87 + 0x4c + lVar71)].ptr[2].numPrimitives;
              lVar79 = *(long *)(lVar11 + lVar79);
              uVar74 = (ulong)*(uint *)(uVar87 + 0xc + lVar71);
              auVar226 = *(undefined1 (*) [16])(lVar79 + uVar74 * 4);
              uVar86 = (ulong)*(uint *)(uVar87 + 0x1c + lVar71);
              auVar7 = *(undefined1 (*) [16])(lVar79 + uVar86 * 4);
              auVar26 = vunpcklps_avx(auVar91,auVar134);
              auVar134 = vunpckhps_avx(auVar91,auVar134);
              auVar27 = vunpcklps_avx(auVar109,auVar226);
              auVar109 = vunpckhps_avx(auVar109,auVar226);
              uVar80 = (ulong)*(uint *)(uVar87 + 0x2c + lVar71);
              auVar91 = *(undefined1 (*) [16])(lVar79 + uVar80 * 4);
              auVar226 = vunpcklps_avx(auVar134,auVar109);
              _local_1490 = vunpcklps_avx(auVar26,auVar27);
              auVar109 = vunpckhps_avx(auVar26,auVar27);
              auVar26 = vunpcklps_avx(auVar131,auVar110);
              auVar134 = vunpckhps_avx(auVar131,auVar110);
              auVar110 = vunpcklps_avx(auVar121,auVar7);
              auVar121 = vunpckhps_avx(auVar121,auVar7);
              uVar84 = (ulong)*(uint *)(uVar87 + 0x3c + lVar71);
              auVar131 = *(undefined1 (*) [16])(lVar79 + uVar84 * 4);
              auVar134 = vunpcklps_avx(auVar134,auVar121);
              auVar7 = vunpcklps_avx(auVar26,auVar110);
              auVar121 = vunpckhps_avx(auVar26,auVar110);
              auVar110 = vunpcklps_avx(auVar92,auVar148);
              auVar92 = vunpckhps_avx(auVar92,auVar148);
              auVar148 = vunpcklps_avx(auVar133,auVar91);
              auVar133 = vunpckhps_avx(auVar133,auVar91);
              lVar75 = (long)(iVar72 + 1) * 0x38;
              lVar79 = *(long *)(*(long *)&pGVar10[2].numPrimitives + lVar75);
              auVar91 = *(undefined1 (*) [16])(lVar79 + (ulong)*(uint *)(uVar87 + lVar71) * 4);
              _local_14a0 = vunpcklps_avx(auVar92,auVar133);
              _local_14e0 = vunpcklps_avx(auVar110,auVar148);
              _local_14d0 = vunpckhps_avx(auVar110,auVar148);
              auVar133 = vunpcklps_avx(auVar132,auVar167);
              auVar92 = vunpckhps_avx(auVar132,auVar167);
              auVar110 = vunpcklps_avx(auVar6,auVar131);
              auVar132 = vunpckhps_avx(auVar6,auVar131);
              lVar73 = *(long *)(lVar73 + lVar75);
              auVar131 = *(undefined1 (*) [16])(lVar73 + uVar70 * 4);
              _local_14b0 = vunpcklps_avx(auVar92,auVar132);
              auVar148 = vunpcklps_avx(auVar133,auVar110);
              _local_14c0 = vunpckhps_avx(auVar133,auVar110);
              lVar12 = *(long *)(local_1830 + lVar75);
              auVar132 = vunpcklps_avx(auVar91,auVar131);
              auVar92 = vunpckhps_avx(auVar91,auVar131);
              auVar91 = *(undefined1 (*) [16])(lVar12 + uVar78 * 4);
              lVar11 = *(long *)(lVar11 + lVar75);
              auVar131 = *(undefined1 (*) [16])(lVar11 + uVar74 * 4);
              auVar133 = vunpcklps_avx(auVar91,auVar131);
              auVar91 = vunpckhps_avx(auVar91,auVar131);
              auVar110 = vunpcklps_avx(auVar92,auVar91);
              auVar167 = vunpcklps_avx(auVar132,auVar133);
              auVar92 = vunpckhps_avx(auVar132,auVar133);
              auVar91 = *(undefined1 (*) [16])(lVar79 + uVar77 * 4);
              auVar131 = *(undefined1 (*) [16])(lVar73 + local_1838 * 4);
              auVar133 = vunpcklps_avx(auVar91,auVar131);
              auVar132 = vunpckhps_avx(auVar91,auVar131);
              auVar91 = *(undefined1 (*) [16])(lVar12 + uVar88 * 4);
              auVar131 = *(undefined1 (*) [16])(lVar11 + uVar86 * 4);
              auVar6 = vunpcklps_avx(auVar91,auVar131);
              auVar91 = vunpckhps_avx(auVar91,auVar131);
              auVar26 = vunpcklps_avx(auVar132,auVar91);
              auVar27 = vunpcklps_avx(auVar133,auVar6);
              auVar132 = vunpckhps_avx(auVar133,auVar6);
              auVar91 = *(undefined1 (*) [16])(lVar79 + uVar81 * 4);
              auVar131 = *(undefined1 (*) [16])(lVar73 + uVar82 * 4);
              auVar6 = vunpcklps_avx(auVar91,auVar131);
              auVar133 = vunpckhps_avx(auVar91,auVar131);
              auVar91 = *(undefined1 (*) [16])(lVar12 + uVar69 * 4);
              auVar131 = *(undefined1 (*) [16])(lVar11 + uVar80 * 4);
              auVar28 = vunpcklps_avx(auVar91,auVar131);
              auVar91 = vunpckhps_avx(auVar91,auVar131);
              auVar29 = vunpcklps_avx(auVar133,auVar91);
              auVar30 = vunpcklps_avx(auVar6,auVar28);
              auVar133 = vunpckhps_avx(auVar6,auVar28);
              auVar91 = *(undefined1 (*) [16])(lVar79 + uVar85 * 4);
              auVar131 = *(undefined1 (*) [16])(lVar73 + uVar83 * 4);
              auVar28 = vunpcklps_avx(auVar91,auVar131);
              auVar6 = vunpckhps_avx(auVar91,auVar131);
              auVar91 = *(undefined1 (*) [16])(lVar12 + uVar76 * 4);
              auVar131 = *(undefined1 (*) [16])(lVar11 + uVar84 * 4);
              auVar31 = vunpcklps_avx(auVar91,auVar131);
              auVar91 = vunpckhps_avx(auVar91,auVar131);
              auVar32 = vunpcklps_avx(auVar6,auVar91);
              auVar33 = vunpcklps_avx(auVar28,auVar31);
              auVar6 = vunpckhps_avx(auVar28,auVar31);
              auVar91 = vshufps_avx(ZEXT416((uint)fVar130),ZEXT416((uint)fVar130),0);
              auVar131 = vshufps_avx(ZEXT416((uint)(1.0 - fVar130)),ZEXT416((uint)(1.0 - fVar130)),0
                                    );
              fVar130 = auVar91._0_4_;
              fVar17 = auVar91._4_4_;
              fVar18 = auVar91._8_4_;
              fVar19 = auVar91._12_4_;
              fVar101 = auVar131._0_4_;
              fVar107 = auVar131._4_4_;
              fVar108 = auVar131._8_4_;
              fVar116 = auVar131._12_4_;
              auVar104._4_4_ = fVar107 * (float)local_1490._4_4_ + auVar167._4_4_ * fVar17;
              auVar104._0_4_ = fVar101 * (float)local_1490._0_4_ + auVar167._0_4_ * fVar130;
              auVar104._8_4_ = fVar108 * fStack_1488 + auVar167._8_4_ * fVar18;
              auVar104._12_4_ = fVar116 * fStack_1484 + auVar167._12_4_ * fVar19;
              local_1640._0_4_ = auVar109._0_4_;
              local_1640._4_4_ = auVar109._4_4_;
              fStack_1638 = auVar109._8_4_;
              fStack_1634 = auVar109._12_4_;
              auVar124._4_4_ = fVar107 * (float)local_1640._4_4_ + fVar17 * auVar92._4_4_;
              auVar124._0_4_ = fVar101 * (float)local_1640._0_4_ + fVar130 * auVar92._0_4_;
              auVar124._8_4_ = fVar108 * fStack_1638 + fVar18 * auVar92._8_4_;
              auVar124._12_4_ = fVar116 * fStack_1634 + fVar19 * auVar92._12_4_;
              local_15e0._0_4_ = auVar226._0_4_;
              local_15e0._4_4_ = auVar226._4_4_;
              fStack_15d8 = auVar226._8_4_;
              fStack_15d4 = auVar226._12_4_;
              auVar163._4_4_ = fVar107 * (float)local_15e0._4_4_ + auVar110._4_4_ * fVar17;
              auVar163._0_4_ = fVar101 * (float)local_15e0._0_4_ + auVar110._0_4_ * fVar130;
              auVar163._8_4_ = fVar108 * fStack_15d8 + auVar110._8_4_ * fVar18;
              auVar163._12_4_ = fVar116 * fStack_15d4 + auVar110._12_4_ * fVar19;
              local_1660._0_4_ = auVar7._0_4_;
              local_1660._4_4_ = auVar7._4_4_;
              fStack_1658 = auVar7._8_4_;
              fStack_1654 = auVar7._12_4_;
              auVar167._0_4_ = fVar101 * (float)local_1660._0_4_ + fVar130 * auVar27._0_4_;
              auVar167._4_4_ = fVar107 * (float)local_1660._4_4_ + fVar17 * auVar27._4_4_;
              auVar167._8_4_ = fVar108 * fStack_1658 + fVar18 * auVar27._8_4_;
              auVar167._12_4_ = fVar116 * fStack_1654 + fVar19 * auVar27._12_4_;
              local_1620._0_4_ = auVar121._0_4_;
              local_1620._4_4_ = auVar121._4_4_;
              fStack_1618 = auVar121._8_4_;
              fStack_1614 = auVar121._12_4_;
              auVar110._0_4_ = fVar101 * (float)local_1620._0_4_ + auVar132._0_4_ * fVar130;
              auVar110._4_4_ = fVar107 * (float)local_1620._4_4_ + auVar132._4_4_ * fVar17;
              auVar110._8_4_ = fVar108 * fStack_1618 + auVar132._8_4_ * fVar18;
              auVar110._12_4_ = fVar116 * fStack_1614 + auVar132._12_4_ * fVar19;
              local_15c0._0_4_ = auVar134._0_4_;
              local_15c0._4_4_ = auVar134._4_4_;
              fStack_15b8 = auVar134._8_4_;
              fStack_15b4 = auVar134._12_4_;
              auVar226._0_4_ = fVar101 * (float)local_15c0._0_4_ + auVar26._0_4_ * fVar130;
              auVar226._4_4_ = fVar107 * (float)local_15c0._4_4_ + auVar26._4_4_ * fVar17;
              auVar226._8_4_ = fVar108 * fStack_15b8 + auVar26._8_4_ * fVar18;
              auVar226._12_4_ = fVar116 * fStack_15b4 + auVar26._12_4_ * fVar19;
              auVar104._20_4_ = fVar107 * (float)local_14e0._4_4_ + fVar17 * auVar30._4_4_;
              auVar104._16_4_ = fVar101 * (float)local_14e0._0_4_ + fVar130 * auVar30._0_4_;
              auVar104._24_4_ = fVar108 * fStack_14d8 + fVar18 * auVar30._8_4_;
              auVar104._28_4_ = fVar116 * fStack_14d4 + fVar19 * auVar30._12_4_;
              auVar124._20_4_ = fVar107 * (float)local_14d0._4_4_ + auVar133._4_4_ * fVar17;
              auVar124._16_4_ = fVar101 * (float)local_14d0._0_4_ + auVar133._0_4_ * fVar130;
              auVar124._24_4_ = fVar108 * fStack_14c8 + auVar133._8_4_ * fVar18;
              auVar124._28_4_ = fVar116 * fStack_14c4 + auVar133._12_4_ * fVar19;
              auVar163._20_4_ = fVar107 * (float)local_14a0._4_4_ + auVar29._4_4_ * fVar17;
              auVar163._16_4_ = fVar101 * (float)local_14a0._0_4_ + auVar29._0_4_ * fVar130;
              auVar163._24_4_ = fVar108 * fStack_1498 + auVar29._8_4_ * fVar18;
              auVar163._28_4_ = fVar116 * fStack_1494 + auVar29._12_4_ * fVar19;
              lVar73 = uVar87 + 0x40 + lVar71;
              local_13e0 = *(undefined8 *)(lVar73 + 0x10);
              uStack_13d8 = *(undefined8 *)(lVar73 + 0x18);
              auVar134._0_4_ = auVar148._0_4_ * fVar101 + fVar130 * auVar33._0_4_;
              auVar134._4_4_ = auVar148._4_4_ * fVar107 + fVar17 * auVar33._4_4_;
              auVar134._8_4_ = auVar148._8_4_ * fVar108 + fVar18 * auVar33._8_4_;
              auVar134._12_4_ = auVar148._12_4_ * fVar116 + fVar19 * auVar33._12_4_;
              uStack_13d0 = local_13e0;
              uStack_13c8 = uStack_13d8;
              lVar71 = uVar87 + 0x50 + lVar71;
              local_1400 = *(undefined8 *)(lVar71 + 0x10);
              uStack_13f8 = *(undefined8 *)(lVar71 + 0x18);
              auVar148._0_4_ = fVar101 * (float)local_14c0._0_4_ + fVar130 * auVar6._0_4_;
              auVar148._4_4_ = fVar107 * (float)local_14c0._4_4_ + fVar17 * auVar6._4_4_;
              auVar148._8_4_ = fVar108 * fStack_14b8 + fVar18 * auVar6._8_4_;
              auVar148._12_4_ = fVar116 * fStack_14b4 + fVar19 * auVar6._12_4_;
              auVar92._0_4_ = fVar101 * (float)local_14b0._0_4_ + fVar130 * auVar32._0_4_;
              auVar92._4_4_ = fVar107 * (float)local_14b0._4_4_ + fVar17 * auVar32._4_4_;
              auVar92._8_4_ = fVar108 * fStack_14a8 + fVar18 * auVar32._8_4_;
              auVar92._12_4_ = fVar116 * fStack_14a4 + fVar19 * auVar32._12_4_;
              uStack_13f0 = local_1400;
              uStack_13e8 = uStack_13f8;
              auVar168._16_16_ = auVar167;
              auVar168._0_16_ = auVar167;
              auVar113._16_16_ = auVar110;
              auVar113._0_16_ = auVar110;
              auVar227._16_16_ = auVar226;
              auVar227._0_16_ = auVar226;
              auVar136._16_16_ = auVar134;
              auVar136._0_16_ = auVar134;
              auVar149._16_16_ = auVar148;
              auVar149._0_16_ = auVar148;
              auVar181._16_16_ = auVar92;
              auVar181._0_16_ = auVar92;
              uVar3 = *(undefined4 *)&(ray->org).field_0;
              auVar196._4_4_ = uVar3;
              auVar196._0_4_ = uVar3;
              auVar196._8_4_ = uVar3;
              auVar196._12_4_ = uVar3;
              auVar196._16_4_ = uVar3;
              auVar196._20_4_ = uVar3;
              auVar196._24_4_ = uVar3;
              auVar196._28_4_ = uVar3;
              uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
              auVar199._4_4_ = uVar4;
              auVar199._0_4_ = uVar4;
              auVar199._8_4_ = uVar4;
              auVar199._12_4_ = uVar4;
              auVar199._16_4_ = uVar4;
              auVar199._20_4_ = uVar4;
              auVar199._24_4_ = uVar4;
              auVar199._28_4_ = uVar4;
              uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
              auVar209._4_4_ = uVar4;
              auVar209._0_4_ = uVar4;
              auVar209._8_4_ = uVar4;
              auVar209._12_4_ = uVar4;
              auVar209._16_4_ = uVar4;
              auVar209._20_4_ = uVar4;
              auVar209._24_4_ = uVar4;
              auVar209._28_4_ = uVar4;
              local_1500 = vsubps_avx(auVar104,auVar196);
              local_1520 = vsubps_avx(auVar124,auVar199);
              local_1540 = vsubps_avx(auVar163,auVar209);
              auVar93 = vsubps_avx(auVar168,auVar196);
              auVar195 = vsubps_avx(auVar113,auVar199);
              auVar20 = vsubps_avx(auVar227,auVar209);
              auVar21 = vsubps_avx(auVar136,auVar196);
              auVar22 = vsubps_avx(auVar149,auVar199);
              auVar23 = vsubps_avx(auVar181,auVar209);
              local_1560 = vsubps_avx(auVar21,local_1500);
              local_1580 = vsubps_avx(auVar22,local_1520);
              _local_15c0 = vsubps_avx(auVar23,local_1540);
              fVar17 = local_1520._0_4_;
              fVar130 = auVar22._0_4_ + fVar17;
              fVar19 = local_1520._4_4_;
              fVar140 = auVar22._4_4_ + fVar19;
              fVar107 = local_1520._8_4_;
              fVar141 = auVar22._8_4_ + fVar107;
              fVar116 = local_1520._12_4_;
              fVar142 = auVar22._12_4_ + fVar116;
              fVar118 = local_1520._16_4_;
              fVar143 = auVar22._16_4_ + fVar118;
              fVar120 = local_1520._20_4_;
              fVar144 = auVar22._20_4_ + fVar120;
              fVar15 = local_1520._24_4_;
              fVar145 = auVar22._24_4_ + fVar15;
              fVar102 = local_1520._28_4_;
              fVar229 = local_1540._0_4_;
              fVar146 = fVar229 + auVar23._0_4_;
              fVar232 = local_1540._4_4_;
              fVar151 = fVar232 + auVar23._4_4_;
              fVar234 = local_1540._8_4_;
              fVar153 = fVar234 + auVar23._8_4_;
              fVar236 = local_1540._12_4_;
              fVar155 = fVar236 + auVar23._12_4_;
              fVar238 = local_1540._16_4_;
              fVar157 = fVar238 + auVar23._16_4_;
              fVar240 = local_1540._20_4_;
              fVar159 = fVar240 + auVar23._20_4_;
              fVar242 = local_1540._24_4_;
              fVar161 = fVar242 + auVar23._24_4_;
              fVar129 = local_1540._28_4_;
              fVar90 = local_15c0._0_4_;
              fVar95 = local_15c0._4_4_;
              auVar34._4_4_ = fVar95 * fVar140;
              auVar34._0_4_ = fVar90 * fVar130;
              fVar96 = local_15c0._8_4_;
              auVar34._8_4_ = fVar96 * fVar141;
              fVar97 = local_15c0._12_4_;
              auVar34._12_4_ = fVar97 * fVar142;
              fVar98 = local_15c0._16_4_;
              auVar34._16_4_ = fVar98 * fVar143;
              fVar99 = local_15c0._20_4_;
              auVar34._20_4_ = fVar99 * fVar144;
              fVar100 = local_15c0._24_4_;
              auVar34._24_4_ = fVar100 * fVar145;
              auVar34._28_4_ = auVar167._12_4_;
              fVar207 = local_1580._0_4_;
              fVar211 = local_1580._4_4_;
              auVar35._4_4_ = fVar211 * fVar151;
              auVar35._0_4_ = fVar207 * fVar146;
              fVar213 = local_1580._8_4_;
              auVar35._8_4_ = fVar213 * fVar153;
              fVar215 = local_1580._12_4_;
              auVar35._12_4_ = fVar215 * fVar155;
              fVar217 = local_1580._16_4_;
              auVar35._16_4_ = fVar217 * fVar157;
              fVar219 = local_1580._20_4_;
              auVar35._20_4_ = fVar219 * fVar159;
              fVar221 = local_1580._24_4_;
              auVar35._24_4_ = fVar221 * fVar161;
              auVar35._28_4_ = auVar92._12_4_;
              auVar24 = vsubps_avx(auVar35,auVar34);
              fVar18 = local_1500._0_4_;
              fVar166 = auVar21._0_4_ + fVar18;
              fVar101 = local_1500._4_4_;
              fVar171 = auVar21._4_4_ + fVar101;
              fVar108 = local_1500._8_4_;
              fVar172 = auVar21._8_4_ + fVar108;
              fVar117 = local_1500._12_4_;
              fVar173 = auVar21._12_4_ + fVar117;
              fVar119 = local_1500._16_4_;
              fVar174 = auVar21._16_4_ + fVar119;
              fVar14 = local_1500._20_4_;
              fVar175 = auVar21._20_4_ + fVar14;
              fVar16 = local_1500._24_4_;
              fVar176 = auVar21._24_4_ + fVar16;
              fVar198 = local_1560._0_4_;
              fVar201 = local_1560._4_4_;
              auVar36._4_4_ = fVar201 * fVar151;
              auVar36._0_4_ = fVar198 * fVar146;
              fVar202 = local_1560._8_4_;
              auVar36._8_4_ = fVar202 * fVar153;
              fVar203 = local_1560._12_4_;
              auVar36._12_4_ = fVar203 * fVar155;
              fVar204 = local_1560._16_4_;
              auVar36._16_4_ = fVar204 * fVar157;
              fVar205 = local_1560._20_4_;
              auVar36._20_4_ = fVar205 * fVar159;
              fVar206 = local_1560._24_4_;
              auVar36._24_4_ = fVar206 * fVar161;
              auVar36._28_4_ = fVar129 + auVar23._28_4_;
              auVar37._4_4_ = fVar95 * fVar171;
              auVar37._0_4_ = fVar90 * fVar166;
              auVar37._8_4_ = fVar96 * fVar172;
              auVar37._12_4_ = fVar97 * fVar173;
              auVar37._16_4_ = fVar98 * fVar174;
              auVar37._20_4_ = fVar99 * fVar175;
              auVar37._24_4_ = fVar100 * fVar176;
              auVar37._28_4_ = uVar3;
              auVar25 = vsubps_avx(auVar37,auVar36);
              auVar38._4_4_ = fVar211 * fVar171;
              auVar38._0_4_ = fVar207 * fVar166;
              auVar38._8_4_ = fVar213 * fVar172;
              auVar38._12_4_ = fVar215 * fVar173;
              auVar38._16_4_ = fVar217 * fVar174;
              auVar38._20_4_ = fVar219 * fVar175;
              auVar38._24_4_ = fVar221 * fVar176;
              auVar38._28_4_ = auVar21._28_4_ + local_1500._28_4_;
              auVar39._4_4_ = fVar201 * fVar140;
              auVar39._0_4_ = fVar198 * fVar130;
              auVar39._8_4_ = fVar202 * fVar141;
              auVar39._12_4_ = fVar203 * fVar142;
              auVar39._16_4_ = fVar204 * fVar143;
              auVar39._20_4_ = fVar205 * fVar144;
              auVar39._24_4_ = fVar206 * fVar145;
              auVar39._28_4_ = auVar22._28_4_ + fVar102;
              auVar94 = vsubps_avx(auVar39,auVar38);
              fStack_187c = (ray->dir).field_0.m128[1];
              fVar130 = (ray->dir).field_0.m128[2];
              local_15a0._4_4_ = fVar130;
              local_15a0._0_4_ = fVar130;
              local_15a0._8_4_ = fVar130;
              local_15a0._12_4_ = fVar130;
              local_15a0._16_4_ = fVar130;
              local_15a0._20_4_ = fVar130;
              local_15a0._24_4_ = fVar130;
              local_15a0._28_4_ = fVar130;
              fStack_17bc = (ray->dir).field_0.m128[0];
              local_1600._0_4_ =
                   auVar24._0_4_ * fStack_17bc +
                   fStack_187c * auVar25._0_4_ + fVar130 * auVar94._0_4_;
              local_1600._4_4_ =
                   auVar24._4_4_ * fStack_17bc +
                   fStack_187c * auVar25._4_4_ + fVar130 * auVar94._4_4_;
              local_1600._8_4_ =
                   auVar24._8_4_ * fStack_17bc +
                   fStack_187c * auVar25._8_4_ + fVar130 * auVar94._8_4_;
              local_1600._12_4_ =
                   auVar24._12_4_ * fStack_17bc +
                   fStack_187c * auVar25._12_4_ + fVar130 * auVar94._12_4_;
              local_1600._16_4_ =
                   auVar24._16_4_ * fStack_17bc +
                   fStack_187c * auVar25._16_4_ + fVar130 * auVar94._16_4_;
              local_1600._20_4_ =
                   auVar24._20_4_ * fStack_17bc +
                   fStack_187c * auVar25._20_4_ + fVar130 * auVar94._20_4_;
              local_1600._24_4_ =
                   auVar24._24_4_ * fStack_17bc +
                   fStack_187c * auVar25._24_4_ + fVar130 * auVar94._24_4_;
              local_1600._28_4_ = auVar25._28_4_ + auVar25._28_4_ + auVar94._28_4_;
              auVar24 = vsubps_avx(local_1520,auVar195);
              _local_15e0 = vsubps_avx(local_1540,auVar20);
              fVar140 = auVar195._0_4_ + fVar17;
              fVar141 = auVar195._4_4_ + fVar19;
              fVar142 = auVar195._8_4_ + fVar107;
              fVar143 = auVar195._12_4_ + fVar116;
              fVar144 = auVar195._16_4_ + fVar118;
              fVar145 = auVar195._20_4_ + fVar120;
              fVar146 = auVar195._24_4_ + fVar15;
              fVar179 = auVar195._28_4_;
              fVar151 = fVar229 + auVar20._0_4_;
              fVar153 = fVar232 + auVar20._4_4_;
              fVar155 = fVar234 + auVar20._8_4_;
              fVar157 = fVar236 + auVar20._12_4_;
              fVar159 = fVar238 + auVar20._16_4_;
              fVar161 = fVar240 + auVar20._20_4_;
              fVar166 = fVar242 + auVar20._24_4_;
              fVar208 = local_15e0._0_4_;
              fVar212 = local_15e0._4_4_;
              auVar40._4_4_ = fVar212 * fVar141;
              auVar40._0_4_ = fVar208 * fVar140;
              fVar214 = local_15e0._8_4_;
              auVar40._8_4_ = fVar214 * fVar142;
              fVar216 = local_15e0._12_4_;
              auVar40._12_4_ = fVar216 * fVar143;
              fVar218 = local_15e0._16_4_;
              auVar40._16_4_ = fVar218 * fVar144;
              fVar220 = local_15e0._20_4_;
              auVar40._20_4_ = fVar220 * fVar145;
              fVar222 = local_15e0._24_4_;
              auVar40._24_4_ = fVar222 * fVar146;
              auVar40._28_4_ = fVar129;
              fVar180 = auVar24._0_4_;
              fVar183 = auVar24._4_4_;
              auVar41._4_4_ = fVar183 * fVar153;
              auVar41._0_4_ = fVar180 * fVar151;
              fVar185 = auVar24._8_4_;
              auVar41._8_4_ = fVar185 * fVar155;
              fVar187 = auVar24._12_4_;
              auVar41._12_4_ = fVar187 * fVar157;
              fVar189 = auVar24._16_4_;
              auVar41._16_4_ = fVar189 * fVar159;
              fVar191 = auVar24._20_4_;
              auVar41._20_4_ = fVar191 * fVar161;
              fVar193 = auVar24._24_4_;
              auVar41._24_4_ = fVar193 * fVar166;
              auVar41._28_4_ = fVar102;
              auVar25 = vsubps_avx(auVar41,auVar40);
              auVar94 = vsubps_avx(local_1500,auVar93);
              fVar230 = auVar94._0_4_;
              fVar233 = auVar94._4_4_;
              auVar42._4_4_ = fVar233 * fVar153;
              auVar42._0_4_ = fVar230 * fVar151;
              fVar235 = auVar94._8_4_;
              auVar42._8_4_ = fVar235 * fVar155;
              fVar237 = auVar94._12_4_;
              auVar42._12_4_ = fVar237 * fVar157;
              fVar239 = auVar94._16_4_;
              auVar42._16_4_ = fVar239 * fVar159;
              fVar241 = auVar94._20_4_;
              auVar42._20_4_ = fVar241 * fVar161;
              fVar243 = auVar94._24_4_;
              auVar42._24_4_ = fVar243 * fVar166;
              auVar42._28_4_ = fVar129 + auVar20._28_4_;
              fVar151 = auVar93._0_4_ + fVar18;
              fVar153 = auVar93._4_4_ + fVar101;
              fVar155 = auVar93._8_4_ + fVar108;
              fVar157 = auVar93._12_4_ + fVar117;
              fVar159 = auVar93._16_4_ + fVar119;
              fVar161 = auVar93._20_4_ + fVar14;
              fVar166 = auVar93._24_4_ + fVar16;
              fVar177 = auVar93._28_4_ + local_1500._28_4_;
              auVar43._4_4_ = fVar212 * fVar153;
              auVar43._0_4_ = fVar208 * fVar151;
              auVar43._8_4_ = fVar214 * fVar155;
              auVar43._12_4_ = fVar216 * fVar157;
              auVar43._16_4_ = fVar218 * fVar159;
              auVar43._20_4_ = fVar220 * fVar161;
              auVar43._24_4_ = fVar222 * fVar166;
              auVar43._28_4_ = local_15e0._28_4_;
              auVar94 = vsubps_avx(auVar43,auVar42);
              auVar44._4_4_ = fVar183 * fVar153;
              auVar44._0_4_ = fVar180 * fVar151;
              auVar44._8_4_ = fVar185 * fVar155;
              auVar44._12_4_ = fVar187 * fVar157;
              auVar44._16_4_ = fVar189 * fVar159;
              auVar44._20_4_ = fVar191 * fVar161;
              auVar44._24_4_ = fVar193 * fVar166;
              auVar44._28_4_ = fVar177;
              auVar45._4_4_ = fVar233 * fVar141;
              auVar45._0_4_ = fVar230 * fVar140;
              auVar45._8_4_ = fVar235 * fVar142;
              auVar45._12_4_ = fVar237 * fVar143;
              auVar45._16_4_ = fVar239 * fVar144;
              auVar45._20_4_ = fVar241 * fVar145;
              auVar45._24_4_ = fVar243 * fVar146;
              auVar45._28_4_ = fVar179 + fVar102;
              auVar103 = vsubps_avx(auVar45,auVar44);
              local_1620._0_4_ =
                   fStack_17bc * auVar25._0_4_ +
                   fStack_187c * auVar94._0_4_ + fVar130 * auVar103._0_4_;
              local_1620._4_4_ =
                   fStack_17bc * auVar25._4_4_ +
                   fStack_187c * auVar94._4_4_ + fVar130 * auVar103._4_4_;
              fStack_1618 = fStack_17bc * auVar25._8_4_ +
                            fStack_187c * auVar94._8_4_ + fVar130 * auVar103._8_4_;
              fStack_1614 = fStack_17bc * auVar25._12_4_ +
                            fStack_187c * auVar94._12_4_ + fVar130 * auVar103._12_4_;
              register0x00001310 =
                   fStack_17bc * auVar25._16_4_ +
                   fStack_187c * auVar94._16_4_ + fVar130 * auVar103._16_4_;
              register0x00001314 =
                   fStack_17bc * auVar25._20_4_ +
                   fStack_187c * auVar94._20_4_ + fVar130 * auVar103._20_4_;
              register0x00001318 =
                   fStack_17bc * auVar25._24_4_ +
                   fStack_187c * auVar94._24_4_ + fVar130 * auVar103._24_4_;
              register0x0000131c = auVar25._28_4_ + auVar94._28_4_ + auVar103._28_4_;
              auVar25 = vsubps_avx(auVar93,auVar21);
              fVar146 = auVar93._0_4_ + auVar21._0_4_;
              fVar151 = auVar93._4_4_ + auVar21._4_4_;
              fVar153 = auVar93._8_4_ + auVar21._8_4_;
              fVar155 = auVar93._12_4_ + auVar21._12_4_;
              fVar157 = auVar93._16_4_ + auVar21._16_4_;
              fVar159 = auVar93._20_4_ + auVar21._20_4_;
              fVar161 = auVar93._24_4_ + auVar21._24_4_;
              fVar166 = auVar93._28_4_ + auVar21._28_4_;
              auVar93 = vsubps_avx(auVar195,auVar22);
              fVar102 = auVar195._0_4_ + auVar22._0_4_;
              fVar140 = auVar195._4_4_ + auVar22._4_4_;
              fVar141 = auVar195._8_4_ + auVar22._8_4_;
              fVar142 = auVar195._12_4_ + auVar22._12_4_;
              fVar143 = auVar195._16_4_ + auVar22._16_4_;
              fVar144 = auVar195._20_4_ + auVar22._20_4_;
              fVar145 = auVar195._24_4_ + auVar22._24_4_;
              auVar21 = vsubps_avx(auVar20,auVar23);
              fVar171 = auVar20._0_4_ + auVar23._0_4_;
              fVar172 = auVar20._4_4_ + auVar23._4_4_;
              fVar173 = auVar20._8_4_ + auVar23._8_4_;
              fVar174 = auVar20._12_4_ + auVar23._12_4_;
              fVar175 = auVar20._16_4_ + auVar23._16_4_;
              fVar176 = auVar20._20_4_ + auVar23._20_4_;
              fVar129 = auVar20._24_4_ + auVar23._24_4_;
              fVar147 = auVar21._0_4_;
              fVar152 = auVar21._4_4_;
              auVar46._4_4_ = fVar152 * fVar140;
              auVar46._0_4_ = fVar147 * fVar102;
              fVar154 = auVar21._8_4_;
              auVar46._8_4_ = fVar154 * fVar141;
              fVar156 = auVar21._12_4_;
              auVar46._12_4_ = fVar156 * fVar142;
              fVar158 = auVar21._16_4_;
              auVar46._16_4_ = fVar158 * fVar143;
              fVar160 = auVar21._20_4_;
              auVar46._20_4_ = fVar160 * fVar144;
              fVar162 = auVar21._24_4_;
              auVar46._24_4_ = fVar162 * fVar145;
              auVar46._28_4_ = fVar177;
              fVar177 = auVar93._0_4_;
              fVar184 = auVar93._4_4_;
              auVar47._4_4_ = fVar184 * fVar172;
              auVar47._0_4_ = fVar177 * fVar171;
              fVar186 = auVar93._8_4_;
              auVar47._8_4_ = fVar186 * fVar173;
              fVar188 = auVar93._12_4_;
              auVar47._12_4_ = fVar188 * fVar174;
              fVar190 = auVar93._16_4_;
              auVar47._16_4_ = fVar190 * fVar175;
              fVar192 = auVar93._20_4_;
              auVar47._20_4_ = fVar192 * fVar176;
              fVar194 = auVar93._24_4_;
              auVar47._24_4_ = fVar194 * fVar129;
              auVar47._28_4_ = fVar179;
              auVar93 = vsubps_avx(auVar47,auVar46);
              fVar223 = auVar25._0_4_;
              fVar225 = auVar25._4_4_;
              auVar48._4_4_ = fVar225 * fVar172;
              auVar48._0_4_ = fVar223 * fVar171;
              fVar171 = auVar25._8_4_;
              auVar48._8_4_ = fVar171 * fVar173;
              fVar172 = auVar25._12_4_;
              auVar48._12_4_ = fVar172 * fVar174;
              fVar173 = auVar25._16_4_;
              auVar48._16_4_ = fVar173 * fVar175;
              fVar174 = auVar25._20_4_;
              auVar48._20_4_ = fVar174 * fVar176;
              fVar175 = auVar25._24_4_;
              auVar48._24_4_ = fVar175 * fVar129;
              auVar48._28_4_ = auVar20._28_4_ + auVar23._28_4_;
              auVar49._4_4_ = fVar152 * fVar151;
              auVar49._0_4_ = fVar147 * fVar146;
              auVar49._8_4_ = fVar154 * fVar153;
              auVar49._12_4_ = fVar156 * fVar155;
              auVar49._16_4_ = fVar158 * fVar157;
              auVar49._20_4_ = fVar160 * fVar159;
              auVar49._24_4_ = fVar162 * fVar161;
              auVar49._28_4_ = fVar179;
              auVar195 = vsubps_avx(auVar49,auVar48);
              auVar50._4_4_ = fVar184 * fVar151;
              auVar50._0_4_ = fVar177 * fVar146;
              auVar50._8_4_ = fVar186 * fVar153;
              auVar50._12_4_ = fVar188 * fVar155;
              auVar50._16_4_ = fVar190 * fVar157;
              auVar50._20_4_ = fVar192 * fVar159;
              auVar50._24_4_ = fVar194 * fVar161;
              auVar50._28_4_ = fVar166;
              auVar51._4_4_ = fVar225 * fVar140;
              auVar51._0_4_ = fVar223 * fVar102;
              auVar51._8_4_ = fVar171 * fVar141;
              auVar51._12_4_ = fVar172 * fVar142;
              auVar51._16_4_ = fVar173 * fVar143;
              auVar51._20_4_ = fVar174 * fVar144;
              auVar51._24_4_ = fVar175 * fVar145;
              auVar51._28_4_ = fVar179 + auVar22._28_4_;
              auVar20 = vsubps_avx(auVar51,auVar50);
              local_1880 = fStack_187c;
              fStack_1878 = fStack_187c;
              fStack_1874 = fStack_187c;
              fStack_1870 = fStack_187c;
              fStack_186c = fStack_187c;
              fStack_1868 = fStack_187c;
              fStack_1864 = fStack_187c;
              local_17c0 = fStack_17bc;
              fStack_17b8 = fStack_17bc;
              fStack_17b4 = fStack_17bc;
              fStack_17b0 = fStack_17bc;
              fStack_17ac = fStack_17bc;
              fStack_17a8 = fStack_17bc;
              fStack_17a4 = fStack_17bc;
              auVar105._0_4_ =
                   fStack_17bc * auVar93._0_4_ +
                   fStack_187c * auVar195._0_4_ + fVar130 * auVar20._0_4_;
              auVar105._4_4_ =
                   fStack_17bc * auVar93._4_4_ +
                   fStack_187c * auVar195._4_4_ + fVar130 * auVar20._4_4_;
              auVar105._8_4_ =
                   fStack_17bc * auVar93._8_4_ +
                   fStack_187c * auVar195._8_4_ + fVar130 * auVar20._8_4_;
              auVar105._12_4_ =
                   fStack_17bc * auVar93._12_4_ +
                   fStack_187c * auVar195._12_4_ + fVar130 * auVar20._12_4_;
              auVar105._16_4_ =
                   fStack_17bc * auVar93._16_4_ +
                   fStack_187c * auVar195._16_4_ + fVar130 * auVar20._16_4_;
              auVar105._20_4_ =
                   fStack_17bc * auVar93._20_4_ +
                   fStack_187c * auVar195._20_4_ + fVar130 * auVar20._20_4_;
              auVar105._24_4_ =
                   fStack_17bc * auVar93._24_4_ +
                   fStack_187c * auVar195._24_4_ + fVar130 * auVar20._24_4_;
              auVar105._28_4_ = fVar166 + fVar166 + auVar20._28_4_;
              local_1660._0_4_ = auVar105._0_4_ + local_1600._0_4_ + (float)local_1620._0_4_;
              local_1660._4_4_ = auVar105._4_4_ + local_1600._4_4_ + (float)local_1620._4_4_;
              fStack_1658 = auVar105._8_4_ + local_1600._8_4_ + fStack_1618;
              fStack_1654 = auVar105._12_4_ + local_1600._12_4_ + fStack_1614;
              register0x00001210 = auVar105._16_4_ + local_1600._16_4_ + register0x00001310;
              register0x00001214 = auVar105._20_4_ + local_1600._20_4_ + register0x00001314;
              register0x00001218 = auVar105._24_4_ + local_1600._24_4_ + register0x00001318;
              register0x0000121c = auVar105._28_4_ + local_1600._28_4_ + register0x0000131c;
              auVar93 = vminps_avx(local_1600,_local_1620);
              auVar93 = vminps_avx(auVar93,auVar105);
              auVar125._8_4_ = 0x7fffffff;
              auVar125._0_8_ = 0x7fffffff7fffffff;
              auVar125._12_4_ = 0x7fffffff;
              auVar125._16_4_ = 0x7fffffff;
              auVar125._20_4_ = 0x7fffffff;
              auVar125._24_4_ = 0x7fffffff;
              auVar125._28_4_ = 0x7fffffff;
              _local_1640 = vandps_avx(_local_1660,auVar125);
              fVar102 = local_1640._0_4_ * 1.1920929e-07;
              fVar140 = local_1640._4_4_ * 1.1920929e-07;
              local_1300._4_4_ = fVar140;
              local_1300._0_4_ = fVar102;
              fVar141 = local_1640._8_4_ * 1.1920929e-07;
              local_1300._8_4_ = fVar141;
              fVar142 = local_1640._12_4_ * 1.1920929e-07;
              local_1300._12_4_ = fVar142;
              fVar143 = local_1640._16_4_ * 1.1920929e-07;
              local_1300._16_4_ = fVar143;
              fVar144 = local_1640._20_4_ * 1.1920929e-07;
              local_1300._20_4_ = fVar144;
              fVar145 = local_1640._24_4_ * 1.1920929e-07;
              local_1300._24_4_ = fVar145;
              local_1300._28_4_ = 0x34000000;
              auVar169._0_8_ = CONCAT44(fVar140,fVar102) ^ 0x8000000080000000;
              auVar169._8_4_ = -fVar141;
              auVar169._12_4_ = -fVar142;
              auVar169._16_4_ = -fVar143;
              auVar169._20_4_ = -fVar144;
              auVar169._24_4_ = -fVar145;
              auVar169._28_4_ = 0xb4000000;
              local_12a0 = vcmpps_avx(auVar93,auVar169,5);
              auVar195 = vmaxps_avx(local_1600,_local_1620);
              auVar93 = vmaxps_avx(auVar195,auVar105);
              auVar93 = vcmpps_avx(auVar93,local_1300,2);
              auVar106 = ZEXT3264(auVar93);
              local_1680 = vorps_avx(local_12a0,auVar93);
              auVar138 = _local_1620;
              if ((((((((local_1680 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_1680 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_1680 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_1680 >> 0x7f,0) == '\0') &&
                    (local_1680 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_1680 >> 0xbf,0) == '\0') &&
                  (local_1680 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_1680[0x1f]) {
LAB_0030f35e:
                auVar139 = ZEXT3264(auVar138);
                auVar128 = ZEXT3264(local_1300);
                auVar115 = ZEXT3264(local_12a0);
                auVar170 = ZEXT3264(local_16a0);
                auVar178 = ZEXT3264(local_16c0);
                auVar182 = ZEXT3264(local_16e0);
                auVar200 = ZEXT3264(local_1700);
                auVar210 = ZEXT3264(local_1720);
                auVar224 = ZEXT3264(local_1740);
                auVar228 = ZEXT3264(local_1760);
                auVar231 = ZEXT3264(local_1780);
                auVar150 = ZEXT3264(local_17a0);
              }
              else {
                auVar52._4_4_ = fVar183 * fVar95;
                auVar52._0_4_ = fVar180 * fVar90;
                auVar52._8_4_ = fVar185 * fVar96;
                auVar52._12_4_ = fVar187 * fVar97;
                auVar52._16_4_ = fVar189 * fVar98;
                auVar52._20_4_ = fVar191 * fVar99;
                auVar52._24_4_ = fVar193 * fVar100;
                auVar52._28_4_ = local_12a0._28_4_;
                auVar53._4_4_ = fVar212 * fVar211;
                auVar53._0_4_ = fVar208 * fVar207;
                auVar53._8_4_ = fVar214 * fVar213;
                auVar53._12_4_ = fVar216 * fVar215;
                auVar53._16_4_ = fVar218 * fVar217;
                auVar53._20_4_ = fVar220 * fVar219;
                auVar53._24_4_ = fVar222 * fVar221;
                auVar53._28_4_ = 0x34000000;
                auVar20 = vsubps_avx(auVar53,auVar52);
                auVar54._4_4_ = fVar212 * fVar184;
                auVar54._0_4_ = fVar208 * fVar177;
                auVar54._8_4_ = fVar214 * fVar186;
                auVar54._12_4_ = fVar216 * fVar188;
                auVar54._16_4_ = fVar218 * fVar190;
                auVar54._20_4_ = fVar220 * fVar192;
                auVar54._24_4_ = fVar222 * fVar194;
                auVar54._28_4_ = auVar195._28_4_;
                auVar55._4_4_ = fVar183 * fVar152;
                auVar55._0_4_ = fVar180 * fVar147;
                auVar55._8_4_ = fVar185 * fVar154;
                auVar55._12_4_ = fVar187 * fVar156;
                auVar55._16_4_ = fVar189 * fVar158;
                auVar55._20_4_ = fVar191 * fVar160;
                auVar55._24_4_ = fVar193 * fVar162;
                auVar55._28_4_ = auVar24._28_4_;
                auVar22 = vsubps_avx(auVar55,auVar54);
                auVar137._8_4_ = 0x7fffffff;
                auVar137._0_8_ = 0x7fffffff7fffffff;
                auVar137._12_4_ = 0x7fffffff;
                auVar137._16_4_ = 0x7fffffff;
                auVar137._20_4_ = 0x7fffffff;
                auVar137._24_4_ = 0x7fffffff;
                auVar137._28_4_ = 0x7fffffff;
                auVar93 = vandps_avx(auVar52,auVar137);
                auVar195 = vandps_avx(auVar54,auVar137);
                auVar93 = vcmpps_avx(auVar93,auVar195,1);
                local_1360 = vblendvps_avx(auVar22,auVar20,auVar93);
                auVar56._4_4_ = fVar233 * fVar152;
                auVar56._0_4_ = fVar230 * fVar147;
                auVar56._8_4_ = fVar235 * fVar154;
                auVar56._12_4_ = fVar237 * fVar156;
                auVar56._16_4_ = fVar239 * fVar158;
                auVar56._20_4_ = fVar241 * fVar160;
                auVar56._24_4_ = fVar243 * fVar162;
                auVar56._28_4_ = auVar93._28_4_;
                auVar57._4_4_ = fVar233 * fVar95;
                auVar57._0_4_ = fVar230 * fVar90;
                auVar57._8_4_ = fVar235 * fVar96;
                auVar57._12_4_ = fVar237 * fVar97;
                auVar57._16_4_ = fVar239 * fVar98;
                auVar57._20_4_ = fVar241 * fVar99;
                auVar57._24_4_ = fVar243 * fVar100;
                auVar57._28_4_ = auVar20._28_4_;
                auVar58._4_4_ = fVar201 * fVar212;
                auVar58._0_4_ = fVar198 * fVar208;
                auVar58._8_4_ = fVar202 * fVar214;
                auVar58._12_4_ = fVar203 * fVar216;
                auVar58._16_4_ = fVar204 * fVar218;
                auVar58._20_4_ = fVar205 * fVar220;
                auVar58._24_4_ = fVar206 * fVar222;
                auVar58._28_4_ = fVar130;
                auVar20 = vsubps_avx(auVar57,auVar58);
                auVar59._4_4_ = fVar212 * fVar225;
                auVar59._0_4_ = fVar208 * fVar223;
                auVar59._8_4_ = fVar214 * fVar171;
                auVar59._12_4_ = fVar216 * fVar172;
                auVar59._16_4_ = fVar218 * fVar173;
                auVar59._20_4_ = fVar220 * fVar174;
                auVar59._24_4_ = fVar222 * fVar175;
                auVar59._28_4_ = auVar195._28_4_;
                auVar22 = vsubps_avx(auVar59,auVar56);
                auVar93 = vandps_avx(auVar58,auVar137);
                auVar195 = vandps_avx(auVar56,auVar137);
                auVar93 = vcmpps_avx(auVar93,auVar195,1);
                local_1340 = vblendvps_avx(auVar22,auVar20,auVar93);
                auVar60._4_4_ = fVar183 * fVar225;
                auVar60._0_4_ = fVar180 * fVar223;
                auVar60._8_4_ = fVar185 * fVar171;
                auVar60._12_4_ = fVar187 * fVar172;
                auVar60._16_4_ = fVar189 * fVar173;
                auVar60._20_4_ = fVar191 * fVar174;
                auVar60._24_4_ = fVar193 * fVar175;
                auVar60._28_4_ = auVar93._28_4_;
                auVar61._4_4_ = fVar201 * fVar183;
                auVar61._0_4_ = fVar198 * fVar180;
                auVar61._8_4_ = fVar202 * fVar185;
                auVar61._12_4_ = fVar203 * fVar187;
                auVar61._16_4_ = fVar204 * fVar189;
                auVar61._20_4_ = fVar205 * fVar191;
                auVar61._24_4_ = fVar206 * fVar193;
                auVar61._28_4_ = auVar20._28_4_;
                auVar62._4_4_ = fVar233 * fVar211;
                auVar62._0_4_ = fVar230 * fVar207;
                auVar62._8_4_ = fVar235 * fVar213;
                auVar62._12_4_ = fVar237 * fVar215;
                auVar62._16_4_ = fVar239 * fVar217;
                auVar62._20_4_ = fVar241 * fVar219;
                auVar62._24_4_ = fVar243 * fVar221;
                auVar62._28_4_ = auVar21._28_4_;
                auVar63._4_4_ = fVar233 * fVar184;
                auVar63._0_4_ = fVar230 * fVar177;
                auVar63._8_4_ = fVar235 * fVar186;
                auVar63._12_4_ = fVar237 * fVar188;
                auVar63._16_4_ = fVar239 * fVar190;
                auVar63._20_4_ = fVar241 * fVar192;
                auVar63._24_4_ = fVar243 * fVar194;
                auVar63._28_4_ = uStack_15a4;
                auVar20 = vsubps_avx(auVar61,auVar62);
                auVar21 = vsubps_avx(auVar63,auVar60);
                auVar93 = vandps_avx(auVar62,auVar137);
                auVar195 = vandps_avx(auVar60,auVar137);
                auVar195 = vcmpps_avx(auVar93,auVar195,1);
                local_1320 = vblendvps_avx(auVar21,auVar20,auVar195);
                auVar91 = vpackssdw_avx(local_1680._0_16_,local_1680._16_16_);
                fVar90 = local_1320._0_4_;
                fVar95 = local_1320._4_4_;
                fVar96 = local_1320._8_4_;
                fVar97 = local_1320._12_4_;
                fVar98 = local_1320._16_4_;
                fVar99 = local_1320._20_4_;
                fVar100 = local_1320._24_4_;
                fVar146 = local_1340._0_4_;
                fVar151 = local_1340._4_4_;
                fVar153 = local_1340._8_4_;
                fVar155 = local_1340._12_4_;
                fVar157 = local_1340._16_4_;
                fVar159 = local_1340._20_4_;
                fVar161 = local_1340._24_4_;
                fVar166 = local_1360._0_4_;
                fVar171 = local_1360._4_4_;
                fVar172 = local_1360._8_4_;
                fVar173 = local_1360._12_4_;
                fVar174 = local_1360._16_4_;
                fVar175 = local_1360._20_4_;
                fVar176 = local_1360._24_4_;
                fVar102 = fVar166 * fStack_17bc + fVar146 * fStack_187c + fVar90 * fVar130;
                fVar140 = fVar171 * fStack_17bc + fVar151 * fStack_187c + fVar95 * fVar130;
                fVar141 = fVar172 * fStack_17bc + fVar153 * fStack_187c + fVar96 * fVar130;
                fVar142 = fVar173 * fStack_17bc + fVar155 * fStack_187c + fVar97 * fVar130;
                fVar143 = fVar174 * fStack_17bc + fVar157 * fStack_187c + fVar98 * fVar130;
                fVar144 = fVar175 * fStack_17bc + fVar159 * fStack_187c + fVar99 * fVar130;
                fVar130 = fVar176 * fStack_17bc + fVar161 * fStack_187c + fVar100 * fVar130;
                fVar145 = auVar20._28_4_ + auVar20._28_4_ + 0.0;
                auVar126._0_4_ = fVar102 + fVar102;
                auVar126._4_4_ = fVar140 + fVar140;
                auVar126._8_4_ = fVar141 + fVar141;
                auVar126._12_4_ = fVar142 + fVar142;
                auVar126._16_4_ = fVar143 + fVar143;
                auVar126._20_4_ = fVar144 + fVar144;
                auVar126._24_4_ = fVar130 + fVar130;
                auVar126._28_4_ = fVar145 + fVar145;
                fVar102 = auVar93._28_4_;
                auVar93 = vrcpps_avx(auVar126);
                fVar140 = fVar166 * fVar18 + fVar146 * fVar17 + fVar90 * fVar229;
                fVar141 = fVar171 * fVar101 + fVar151 * fVar19 + fVar95 * fVar232;
                fVar142 = fVar172 * fVar108 + fVar153 * fVar107 + fVar96 * fVar234;
                fVar116 = fVar173 * fVar117 + fVar155 * fVar116 + fVar97 * fVar236;
                fVar117 = fVar174 * fVar119 + fVar157 * fVar118 + fVar98 * fVar238;
                fVar118 = fVar175 * fVar14 + fVar159 * fVar120 + fVar99 * fVar240;
                fVar119 = fVar176 * fVar16 + fVar161 * fVar15 + fVar100 * fVar242;
                fVar120 = fVar102 + fVar102 + fVar145;
                fVar130 = auVar93._0_4_;
                fVar17 = auVar93._4_4_;
                auVar64._4_4_ = auVar126._4_4_ * fVar17;
                auVar64._0_4_ = auVar126._0_4_ * fVar130;
                fVar18 = auVar93._8_4_;
                auVar64._8_4_ = auVar126._8_4_ * fVar18;
                fVar19 = auVar93._12_4_;
                auVar64._12_4_ = auVar126._12_4_ * fVar19;
                fVar101 = auVar93._16_4_;
                auVar64._16_4_ = auVar126._16_4_ * fVar101;
                fVar107 = auVar93._20_4_;
                auVar64._20_4_ = auVar126._20_4_ * fVar107;
                fVar108 = auVar93._24_4_;
                auVar64._24_4_ = auVar126._24_4_ * fVar108;
                auVar64._28_4_ = fVar102;
                auVar138._8_4_ = 0x3f800000;
                auVar138._0_8_ = &DAT_3f8000003f800000;
                auVar138._12_4_ = 0x3f800000;
                auVar138._16_4_ = 0x3f800000;
                auVar138._20_4_ = 0x3f800000;
                auVar138._24_4_ = 0x3f800000;
                auVar138._28_4_ = 0x3f800000;
                auVar93 = vsubps_avx(auVar138,auVar64);
                uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
                auVar164._4_4_ = uVar3;
                auVar164._0_4_ = uVar3;
                auVar164._8_4_ = uVar3;
                auVar164._12_4_ = uVar3;
                auVar164._16_4_ = uVar3;
                auVar164._20_4_ = uVar3;
                auVar164._24_4_ = uVar3;
                auVar164._28_4_ = uVar3;
                local_12a0._4_4_ = (fVar141 + fVar141) * (fVar17 + fVar17 * auVar93._4_4_);
                local_12a0._0_4_ = (fVar140 + fVar140) * (fVar130 + fVar130 * auVar93._0_4_);
                local_12a0._8_4_ = (fVar142 + fVar142) * (fVar18 + fVar18 * auVar93._8_4_);
                local_12a0._12_4_ = (fVar116 + fVar116) * (fVar19 + fVar19 * auVar93._12_4_);
                local_12a0._16_4_ = (fVar117 + fVar117) * (fVar101 + fVar101 * auVar93._16_4_);
                local_12a0._20_4_ = (fVar118 + fVar118) * (fVar107 + fVar107 * auVar93._20_4_);
                local_12a0._24_4_ = (fVar119 + fVar119) * (fVar108 + fVar108 * auVar93._24_4_);
                local_12a0._28_4_ = fVar120 + fVar120;
                auVar93 = vcmpps_avx(auVar164,local_12a0,2);
                fVar130 = ray->tfar;
                auVar165._4_4_ = fVar130;
                auVar165._0_4_ = fVar130;
                auVar165._8_4_ = fVar130;
                auVar165._12_4_ = fVar130;
                auVar165._16_4_ = fVar130;
                auVar165._20_4_ = fVar130;
                auVar165._24_4_ = fVar130;
                auVar165._28_4_ = fVar130;
                auVar195 = vcmpps_avx(local_12a0,auVar165,2);
                auVar93 = vandps_avx(auVar195,auVar93);
                auVar195 = vcmpps_avx(auVar126,_DAT_02020f00,4);
                auVar93 = vandps_avx(auVar93,auVar195);
                auVar131 = vpackssdw_avx(auVar93._0_16_,auVar93._16_16_);
                auVar91 = vpand_avx(auVar131,auVar91);
                auVar106 = ZEXT1664(auVar91);
                auVar131 = vpmovsxwd_avx(auVar91);
                auVar92 = vpshufd_avx(auVar91,0xee);
                auVar92 = vpmovsxwd_avx(auVar92);
                local_1300._16_16_ = auVar92;
                local_1300._0_16_ = auVar131;
                if ((((((((local_1300 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_1300 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_1300 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_1300 >> 0x7f,0) == '\0') &&
                      (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB161(auVar92 >> 0x3f,0) == '\0') &&
                    (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar92[0xf]) goto LAB_0030f35e;
                local_13c0 = local_1600._0_4_;
                fStack_13bc = local_1600._4_4_;
                fStack_13b8 = local_1600._8_4_;
                fStack_13b4 = local_1600._12_4_;
                fStack_13b0 = local_1600._16_4_;
                fStack_13ac = local_1600._20_4_;
                fStack_13a8 = local_1600._24_4_;
                fStack_13a4 = local_1600._28_4_;
                local_13a0 = (float)local_1620._0_4_;
                fStack_139c = (float)local_1620._4_4_;
                fStack_1398 = fStack_1618;
                fStack_1394 = fStack_1614;
                fStack_1390 = register0x00001310;
                fStack_138c = register0x00001314;
                fStack_1388 = register0x00001318;
                fStack_1384 = register0x0000131c;
                local_1380 = _local_1660;
                local_1220 = local_1460;
                auVar93 = vrcpps_avx(_local_1660);
                fVar130 = auVar93._0_4_;
                fVar17 = auVar93._4_4_;
                auVar65._4_4_ = (float)local_1660._4_4_ * fVar17;
                auVar65._0_4_ = (float)local_1660._0_4_ * fVar130;
                fVar18 = auVar93._8_4_;
                auVar65._8_4_ = fStack_1658 * fVar18;
                fVar19 = auVar93._12_4_;
                auVar65._12_4_ = fStack_1654 * fVar19;
                fVar101 = auVar93._16_4_;
                auVar65._16_4_ = register0x00001210 * fVar101;
                fVar107 = auVar93._20_4_;
                auVar65._20_4_ = register0x00001214 * fVar107;
                fVar108 = auVar93._24_4_;
                auVar65._24_4_ = register0x00001218 * fVar108;
                auVar65._28_4_ = auVar92._12_4_;
                auVar197._8_4_ = 0x3f800000;
                auVar197._0_8_ = &DAT_3f8000003f800000;
                auVar197._12_4_ = 0x3f800000;
                auVar197._16_4_ = 0x3f800000;
                auVar197._20_4_ = 0x3f800000;
                auVar197._24_4_ = 0x3f800000;
                auVar197._28_4_ = 0x3f800000;
                auVar195 = vsubps_avx(auVar197,auVar65);
                auVar114._0_4_ = fVar130 + fVar130 * auVar195._0_4_;
                auVar114._4_4_ = fVar17 + fVar17 * auVar195._4_4_;
                auVar114._8_4_ = fVar18 + fVar18 * auVar195._8_4_;
                auVar114._12_4_ = fVar19 + fVar19 * auVar195._12_4_;
                auVar114._16_4_ = fVar101 + fVar101 * auVar195._16_4_;
                auVar114._20_4_ = fVar107 + fVar107 * auVar195._20_4_;
                auVar114._24_4_ = fVar108 + fVar108 * auVar195._24_4_;
                auVar114._28_4_ = auVar93._28_4_ + auVar195._28_4_;
                auVar127._8_4_ = 0x219392ef;
                auVar127._0_8_ = 0x219392ef219392ef;
                auVar127._12_4_ = 0x219392ef;
                auVar127._16_4_ = 0x219392ef;
                auVar127._20_4_ = 0x219392ef;
                auVar127._24_4_ = 0x219392ef;
                auVar127._28_4_ = 0x219392ef;
                auVar195 = vcmpps_avx(_local_1640,auVar127,5);
                auVar93 = vandps_avx(auVar195,auVar114);
                auVar66._4_4_ = local_1600._4_4_ * auVar93._4_4_;
                auVar66._0_4_ = local_1600._0_4_ * auVar93._0_4_;
                auVar66._8_4_ = local_1600._8_4_ * auVar93._8_4_;
                auVar66._12_4_ = local_1600._12_4_ * auVar93._12_4_;
                auVar66._16_4_ = local_1600._16_4_ * auVar93._16_4_;
                auVar66._20_4_ = local_1600._20_4_ * auVar93._20_4_;
                auVar66._24_4_ = local_1600._24_4_ * auVar93._24_4_;
                auVar66._28_4_ = auVar195._28_4_;
                auVar195 = vminps_avx(auVar66,auVar197);
                auVar67._4_4_ = (float)local_1620._4_4_ * auVar93._4_4_;
                auVar67._0_4_ = (float)local_1620._0_4_ * auVar93._0_4_;
                auVar67._8_4_ = fStack_1618 * auVar93._8_4_;
                auVar67._12_4_ = fStack_1614 * auVar93._12_4_;
                auVar67._16_4_ = register0x00001310 * auVar93._16_4_;
                auVar67._20_4_ = register0x00001314 * auVar93._20_4_;
                auVar67._24_4_ = register0x00001318 * auVar93._24_4_;
                auVar67._28_4_ = auVar93._28_4_;
                auVar93 = vminps_avx(auVar67,auVar197);
                auVar20 = vsubps_avx(auVar197,auVar195);
                auVar21 = vsubps_avx(auVar197,auVar93);
                local_12c0 = vblendvps_avx(auVar93,auVar20,local_1460);
                local_12e0 = vblendvps_avx(auVar195,auVar21,local_1460);
                auVar139 = ZEXT3264(local_1480);
                fVar130 = local_1480._0_4_;
                fVar17 = local_1480._4_4_;
                local_1280._4_4_ = fVar171 * fVar17;
                local_1280._0_4_ = fVar166 * fVar130;
                fVar18 = local_1480._8_4_;
                local_1280._8_4_ = fVar172 * fVar18;
                fVar19 = local_1480._12_4_;
                local_1280._12_4_ = fVar173 * fVar19;
                fVar101 = local_1480._16_4_;
                local_1280._16_4_ = fVar174 * fVar101;
                fVar107 = local_1480._20_4_;
                local_1280._20_4_ = fVar175 * fVar107;
                fVar108 = local_1480._24_4_;
                local_1280._24_4_ = fVar176 * fVar108;
                local_1280._28_4_ = local_12c0._28_4_;
                auVar115 = ZEXT3264(local_1280);
                local_1260._4_4_ = fVar151 * fVar17;
                local_1260._0_4_ = fVar146 * fVar130;
                local_1260._8_4_ = fVar153 * fVar18;
                local_1260._12_4_ = fVar155 * fVar19;
                local_1260._16_4_ = fVar157 * fVar101;
                local_1260._20_4_ = fVar159 * fVar107;
                local_1260._24_4_ = fVar161 * fVar108;
                local_1260._28_4_ = local_12e0._28_4_;
                auVar128 = ZEXT3264(local_1260);
                local_1240[0] = fVar130 * fVar90;
                local_1240[1] = fVar17 * fVar95;
                local_1240[2] = fVar18 * fVar96;
                local_1240[3] = fVar19 * fVar97;
                fStack_1230 = fVar101 * fVar98;
                fStack_122c = fVar107 * fVar99;
                fStack_1228 = fVar108 * fVar100;
                uStack_1224 = local_1320._28_4_;
                auVar91 = vpsllw_avx(auVar91,0xf);
                auVar91 = vpacksswb_avx(auVar91,auVar91);
                uVar74 = (ulong)(byte)(SUB161(auVar91 >> 7,0) & 1 |
                                       (SUB161(auVar91 >> 0xf,0) & 1) << 1 |
                                       (SUB161(auVar91 >> 0x17,0) & 1) << 2 |
                                       (SUB161(auVar91 >> 0x1f,0) & 1) << 3 |
                                       (SUB161(auVar91 >> 0x27,0) & 1) << 4 |
                                       (SUB161(auVar91 >> 0x2f,0) & 1) << 5 |
                                       (SUB161(auVar91 >> 0x37,0) & 1) << 6 |
                                      SUB161(auVar91 >> 0x3f,0) << 7);
                auVar170 = ZEXT3264(local_16a0);
                auVar178 = ZEXT3264(local_16c0);
                auVar182 = ZEXT3264(local_16e0);
                auVar200 = ZEXT3264(local_1700);
                auVar210 = ZEXT3264(local_1720);
                auVar224 = ZEXT3264(local_1740);
                auVar228 = ZEXT3264(local_1760);
                auVar231 = ZEXT3264(local_1780);
                auVar150 = ZEXT3264(local_17a0);
                do {
                  uVar77 = 0;
                  if (uVar74 != 0) {
                    for (; (uVar74 >> uVar77 & 1) == 0; uVar77 = uVar77 + 1) {
                    }
                  }
                  local_1808 = *(uint *)((long)&local_13e0 + uVar77 * 4);
                  pGVar10 = (pSVar8->geometries).items[local_1808].ptr;
                  if ((pGVar10->mask & ray->mask) == 0) {
                    uVar74 = uVar74 ^ 1L << (uVar77 & 0x3f);
                    bVar68 = true;
                  }
                  else {
                    pRVar13 = context->args;
                    if ((pRVar13->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                      bVar68 = false;
                    }
                    else {
                      local_1814 = *(undefined4 *)(local_12e0 + uVar77 * 4);
                      local_1810 = *(uint *)(local_12c0 + uVar77 * 4);
                      auVar106 = ZEXT464(local_1810);
                      local_17f0.context = context->user;
                      local_180c = *(undefined4 *)((long)&local_1400 + uVar77 * 4);
                      local_1820 = *(uint *)(local_1280 + uVar77 * 4);
                      auVar115 = ZEXT464(local_1820);
                      local_181c = local_1240[uVar77 - 8];
                      auVar128 = ZEXT464((uint)local_181c);
                      local_1818 = local_1240[uVar77];
                      auVar139 = ZEXT464((uint)local_1818);
                      local_1804 = (local_17f0.context)->instID[0];
                      local_1800 = (local_17f0.context)->instPrimID[0];
                      local_1880 = ray->tfar;
                      ray->tfar = *(float *)(local_12a0 + uVar77 * 4);
                      local_18b4 = -1;
                      local_17f0.valid = &local_18b4;
                      local_17f0.geometryUserPtr = pGVar10->userPtr;
                      local_17f0.hit = (RTCHitN *)&local_1820;
                      local_17f0.N = 1;
                      local_17f0.ray = (RTCRayN *)ray;
                      if (pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0030f292:
                        if (pRVar13->filter != (RTCFilterFunctionN)0x0) {
                          if (((pRVar13->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar10->field_8).field_0x2 & 0x40) != 0)) {
                            auVar115 = ZEXT1664(auVar115._0_16_);
                            auVar128 = ZEXT1664(auVar128._0_16_);
                            auVar139 = ZEXT1664(auVar139._0_16_);
                            (*pRVar13->filter)(&local_17f0);
                            auVar106._8_56_ = extraout_var_00;
                            auVar106._0_8_ = extraout_XMM1_Qa_00;
                            auVar150 = ZEXT3264(local_17a0);
                            auVar231 = ZEXT3264(local_1780);
                            auVar228 = ZEXT3264(local_1760);
                            auVar224 = ZEXT3264(local_1740);
                            auVar210 = ZEXT3264(local_1720);
                            auVar200 = ZEXT3264(local_1700);
                            auVar182 = ZEXT3264(local_16e0);
                            auVar178 = ZEXT3264(local_16c0);
                            auVar170 = ZEXT3264(local_16a0);
                          }
                          if (*local_17f0.valid == 0) goto LAB_0030f329;
                        }
                        bVar68 = false;
                      }
                      else {
                        auVar115 = ZEXT464(local_1820);
                        auVar128 = ZEXT464((uint)local_181c);
                        auVar139 = ZEXT464((uint)local_1818);
                        (*pGVar10->occlusionFilterN)(&local_17f0);
                        auVar106._8_56_ = extraout_var;
                        auVar106._0_8_ = extraout_XMM1_Qa;
                        auVar150 = ZEXT3264(local_17a0);
                        auVar231 = ZEXT3264(local_1780);
                        auVar228 = ZEXT3264(local_1760);
                        auVar224 = ZEXT3264(local_1740);
                        auVar210 = ZEXT3264(local_1720);
                        auVar200 = ZEXT3264(local_1700);
                        auVar182 = ZEXT3264(local_16e0);
                        auVar178 = ZEXT3264(local_16c0);
                        auVar170 = ZEXT3264(local_16a0);
                        if (*local_17f0.valid != 0) goto LAB_0030f292;
LAB_0030f329:
                        ray->tfar = local_1880;
                        uVar74 = uVar74 ^ 1L << (uVar77 & 0x3f);
                        bVar68 = true;
                      }
                    }
                  }
                  iVar72 = 0;
                  if (!bVar68) {
                    uVar74 = local_18a8;
                    uVar77 = local_1890;
                    uVar81 = local_1898;
                    uVar85 = local_18a0;
                    uVar88 = local_18b0;
                    if (bVar89) {
                      ray->tfar = -INFINITY;
                      iVar72 = 3;
                    }
                    goto LAB_0030f43c;
                  }
                } while (uVar74 != 0);
              }
              local_1840 = local_1840 + 1;
              bVar89 = local_1840 < local_1848;
            } while (local_1840 != local_1848);
            iVar72 = 0;
            uVar74 = local_18a8;
            uVar77 = local_1890;
            uVar81 = local_1898;
            uVar85 = local_18a0;
            uVar88 = local_18b0;
          }
        }
LAB_0030f43c:
      } while (iVar72 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }